

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::AddInstallComponent(cmGlobalGenerator *this,char *component)

{
  allocator local_39;
  value_type local_38;
  char *local_18;
  char *component_local;
  cmGlobalGenerator *this_local;
  
  if ((component != (char *)0x0) && (*component != '\0')) {
    local_18 = component;
    component_local = (char *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,component,&local_39);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->InstallComponents,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddInstallComponent(const char* component)
{
  if (component && *component) {
    this->InstallComponents.insert(component);
  }
}